

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * __thiscall
doctest::detail::stringifyBinaryExpr<std::__cxx11::wstring,wchar_t[18]>
          (String *__return_storage_ptr__,detail *this,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *lhs,char *op,
          wchar_t (*rhs) [18])

{
  size_t sVar1;
  char *__dest;
  anon_union_24_2_13149d16_for_String_2 local_90;
  anon_union_24_2_13149d16_for_String_2 local_78;
  anon_union_24_2_13149d16_for_String_2 local_60;
  anon_union_24_2_13149d16_for_String_2 local_48;
  
  local_48.buf[0x17] = '\x14';
  local_48._0_4_ = 0x7d3f7b;
  sVar1 = strlen((char *)lhs);
  __dest = String::allocate((String *)&local_60.data,(uint)sVar1);
  memcpy(__dest,lhs,sVar1 & 0xffffffff);
  operator+((String *)&local_78.data,(String *)&local_48.data,(String *)&local_60.data);
  StringMakerBase<true>::convert<wchar_t[18]>((String *)&local_90.data,(wchar_t (*) [18])op);
  operator+(__return_storage_ptr__,(String *)&local_78.data,(String *)&local_90.data);
  if ((local_90.buf[0x17] < '\0') && (local_90.data.ptr != (char *)0x0)) {
    operator_delete__(local_90.data.ptr);
  }
  if ((local_78.buf[0x17] < '\0') && (local_78.data.ptr != (char *)0x0)) {
    operator_delete__(local_78.data.ptr);
  }
  if ((local_60.buf[0x17] < '\0') && (local_60.data.ptr != (char *)0x0)) {
    operator_delete__(local_60.data.ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }